

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Discard.cc
# Opt level: O0

void __thiscall Pl_Discard::~Pl_Discard(Pl_Discard *this)

{
  Pl_Discard *this_local;
  
  ~Pl_Discard(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Pl_Discard::~Pl_Discard() = default;